

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::RoundingImpl::chooseMultiplierAndApply
          (RoundingImpl *this,DecimalQuantity *input,MultiplierProducer *producer,UErrorCode *status
          )

{
  bool bVar1;
  UBool UVar2;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  int _multiplier;
  int multiplier;
  int magnitude;
  UErrorCode *status_local;
  MultiplierProducer *producer_local;
  DecimalQuantity *input_local;
  RoundingImpl *this_local;
  
  uVar3 = DecimalQuantity::getMagnitude(input);
  this_local._4_4_ = (*producer->_vptr_MultiplierProducer[2])(producer,(ulong)uVar3);
  DecimalQuantity::adjustMagnitude(input,this_local._4_4_);
  apply(this,input,status);
  bVar1 = DecimalQuantity::isZero(input);
  if ((((!bVar1) && (UVar2 = ::U_FAILURE(*status), UVar2 == '\0')) &&
      (iVar4 = DecimalQuantity::getMagnitude(input), iVar4 != uVar3 + this_local._4_4_)) &&
     (iVar5 = (*producer->_vptr_MultiplierProducer[2])(producer,(ulong)(uVar3 + 1)),
     this_local._4_4_ != iVar5)) {
    DecimalQuantity::adjustMagnitude(input,iVar5 - this_local._4_4_);
    apply(this,input,status);
    this_local._4_4_ = iVar5;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
RoundingImpl::chooseMultiplierAndApply(impl::DecimalQuantity &input, const impl::MultiplierProducer &producer,
                                  UErrorCode &status) {
    // Do not call this method with zero.
    U_ASSERT(!input.isZero());

    // Perform the first attempt at rounding.
    int magnitude = input.getMagnitude();
    int multiplier = producer.getMultiplier(magnitude);
    input.adjustMagnitude(multiplier);
    apply(input, status);

    // If the number rounded to zero, exit.
    if (input.isZero() || U_FAILURE(status)) {
        return multiplier;
    }

    // If the new magnitude after rounding is the same as it was before rounding, then we are done.
    // This case applies to most numbers.
    if (input.getMagnitude() == magnitude + multiplier) {
        return multiplier;
    }

    // If the above case DIDN'T apply, then we have a case like 99.9 -> 100 or 999.9 -> 1000:
    // The number rounded up to the next magnitude. Check if the multiplier changes; if it doesn't,
    // we do not need to make any more adjustments.
    int _multiplier = producer.getMultiplier(magnitude + 1);
    if (multiplier == _multiplier) {
        return multiplier;
    }

    // We have a case like 999.9 -> 1000, where the correct output is "1K", not "1000".
    // Fix the magnitude and re-apply the rounding strategy.
    input.adjustMagnitude(_multiplier - multiplier);
    apply(input, status);
    return _multiplier;
}